

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

ScriptFunction *
Js::ScriptFunction::OP_NewClassConstructor
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,Var homeObj,
          RecyclableObject *constructorParent)

{
  FunctionProxy *this;
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  int iVar4;
  ScriptContext *pSVar5;
  ScriptFunctionType *pSVar6;
  undefined4 extraout_var;
  DynamicTypeHandler *typeHandler;
  ScriptFunction *this_00;
  RecyclableObject *pRVar7;
  ParseableFunctionInfo *this_01;
  undefined4 *puVar8;
  JavascriptString *local_48;
  JavascriptString *functionName;
  undefined1 local_31;
  
  pSVar5 = FunctionProxy::GetScriptContext((infoRef->ptr->functionBodyImpl).ptr);
  functionName = (JavascriptString *)pSVar5->threadContext;
  local_31 = ((ThreadContext *)functionName)->noJsReentrancy;
  ((ThreadContext *)functionName)->noJsReentrancy = true;
  this = (infoRef->ptr->functionBodyImpl).ptr;
  pSVar6 = FunctionProxy::GetUndeferredFunctionType(this);
  if (pSVar6 == (ScriptFunctionType *)0x0) {
    iVar4 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(this);
    if ((char16 *)CONCAT44(extraout_var,iVar4) == L"Anonymous function") {
      pSVar5 = FunctionProxy::GetScriptContext(this);
      typeHandler = JavascriptLibrary::AnonymousClassConstructorTypeHandler
                              ((pSVar5->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      pSVar5 = FunctionProxy::GetScriptContext(this);
      typeHandler = JavascriptLibrary::ClassConstructorTypeHandler
                              ((pSVar5->super_ScriptContextBase).javascriptLibrary);
    }
    pSVar6 = ScriptFunctionType::New(this,typeHandler,constructorParent,true);
    FunctionProxy::SetUndeferredFunctionType(this,pSVar6);
  }
  this_00 = OP_NewScFuncHomeObj(environment,infoRef,homeObj);
  pRVar7 = RecyclableObject::GetPrototype((RecyclableObject *)this_00);
  if (pRVar7 != constructorParent) {
    (*(this_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x4b])(this_00,constructorParent);
  }
  this_01 = FunctionProxy::EnsureDeserialized((infoRef->ptr->functionBodyImpl).ptr);
  AVar3 = ParseableFunctionInfo::GetReportedInParamsCount(this_01);
  DynamicObject::SetSlot
            ((DynamicObject *)this_00,-1,false,1,(Var)((ulong)(AVar3 - 1) | 0x1000000000000));
  iVar4 = (*(this_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x77])(this_00);
  if (((char)iVar4 == '\0') &&
     ((((this_00->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->attributes &
      ComputedName) == None)) {
    local_48 = (JavascriptString *)0x0;
    bVar2 = JavascriptFunction::GetFunctionName((JavascriptFunction *)this_00,&local_48);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0xa1,"(result)","result");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    DynamicObject::SetSlot((DynamicObject *)this_00,-1,false,2,local_48);
  }
  *(undefined1 *)&functionName[8].super_RecyclableObject.type.ptr = local_31;
  return this_00;
}

Assistant:

ScriptFunction * ScriptFunction::OP_NewClassConstructor(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, Var homeObj, RecyclableObject *constructorParent)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewClassConstructor, reentrancylock, (*infoRef)->GetFunctionProxy()->GetScriptContext()->GetThreadContext());
        FunctionProxy * proxy = (*infoRef)->GetFunctionProxy();
        if (proxy->GetUndeferredFunctionType() == nullptr)
        {
            DynamicTypeHandler * typeHandler = proxy->GetIsAnonymousFunction() 
                ? proxy->GetScriptContext()->GetLibrary()->AnonymousClassConstructorTypeHandler()
                : proxy->GetScriptContext()->GetLibrary()->ClassConstructorTypeHandler();
            ScriptFunctionType * newType = ScriptFunctionType::New(proxy, typeHandler, constructorParent, true);
            proxy->SetUndeferredFunctionType(newType);
        }
        ScriptFunction * scriptFunction = OP_NewScFuncHomeObj(environment, infoRef, homeObj);
        if (scriptFunction->GetPrototype() != constructorParent)
        {
            scriptFunction->SetPrototype(constructorParent);
        }

        Var length = TaggedInt::ToVarUnchecked((*infoRef)->GetFunctionProxy()->EnsureDeserialized()->GetReportedInParamsCount() - 1);
        scriptFunction->SetSlot(SetSlotArguments(Constants::NoProperty, 1, length));

        if (!scriptFunction->IsAnonymousFunction() && !scriptFunction->GetFunctionInfo()->HasComputedName())
        {
            JavascriptString * functionName = nullptr;
            bool result = scriptFunction->GetFunctionName(&functionName);
            Assert(result);
            scriptFunction->SetSlot(SetSlotArguments(Constants::NoProperty, 2, functionName));
        }

        return scriptFunction;
        JIT_HELPER_END(ScrFunc_OP_NewClassConstructor);
    }